

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O1

int please_continue(void *userp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                   curl_off_t ulnow)

{
  int iVar1;
  
  if ((*(int *)((long)userp + 8) != 0) &&
     (iVar1 = *(int *)((long)userp + 0x10) + 1, *(int *)((long)userp + 0x10) = iVar1, iVar1 == 2)) {
    curl_easy_pause(*userp,0);
  }
  curl_mfprintf(_stderr,"xferinfo: paused %d\n",*(undefined4 *)((long)userp + 8));
  return 0;
}

Assistant:

static int please_continue(void *userp,
                           curl_off_t dltotal,
                           curl_off_t dlnow,
                           curl_off_t ultotal,
                           curl_off_t ulnow)
{
  struct transfer_status *st = (struct transfer_status *)userp;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  if(st->halted) {
    st->please++;
    if(st->please == 2) {
      /* waited enough, unpause! */
      curl_easy_pause(st->easy, CURLPAUSE_CONT);
    }
  }
  fprintf(stderr, "xferinfo: paused %d\n", st->halted);
  return 0; /* go on */
}